

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

AppendResult __thiscall
metaf::MinMaxTemperatureGroup::appendForecast(MinMaxTemperatureGroup *this,string *group)

{
  Temperature *this_00;
  Temperature *this_01;
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  _Optional_payload_base<int> _Var4;
  _Optional_payload_base<int> _Var5;
  _Optional_payload_base<int> _Var6;
  optional<float> oVar7;
  optional<float> oVar8;
  Temperature __tmp;
  optional<metaf::MinMaxTemperatureGroup> nextGroup;
  
  if ((((this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == true) &&
      ((this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>._M_engaged == true)) && (this->isIncomplete != true)) {
    return NOT_APPENDED;
  }
  fromForecast(&nextGroup,group);
  if (nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_engaged != true) {
    return NOT_APPENDED;
  }
  if (this->isIncomplete !=
      nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.isIncomplete)
  {
    return NOT_APPENDED;
  }
  this_00 = &this->minTemp;
  if (this->isIncomplete == false) {
    bVar1 = (this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_engaged;
    if ((bVar1 == true) &&
       (nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.minTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged != false)) {
      return NOT_APPENDED;
    }
    bVar2 = (this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_engaged;
    if ((bVar2 == true) &&
       (nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged != false)) {
      return NOT_APPENDED;
    }
    if ((bVar1 == false) &&
       (nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.minTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged == true)) {
      (this->minTemp).freezing =
           (bool)nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                 _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload.
                 _12_1_;
      (this->minTemp).precise =
           (bool)nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                 _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload.
                 _13_1_;
      _Var4._4_4_ = nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._8_4_;
      _Var4._M_payload =
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.minTemp.
           tempValue.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_payload;
      (this_00->tempValue).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> = _Var4;
      *(undefined4 *)
       &(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged =
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._44_4_;
      (this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._28_8_;
      *(undefined8 *)
       ((long)&(this->minTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._36_8_;
    }
    if ((bVar2 == false) &&
       (nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
        tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
        ._M_engaged == true)) {
      (this->maxTemp).freezing =
           (bool)nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                 _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload.
                 _24_1_;
      (this->maxTemp).precise =
           (bool)nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                 _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload.
                 _25_1_;
      _Var6._4_4_ = nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>.
                    _M_payload.super__Optional_payload_base<metaf::MinMaxTemperatureGroup>.
                    _M_payload._20_4_;
      _Var6._M_payload =
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
           tempValue.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_payload;
      (this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int> = _Var6;
      *(undefined4 *)
       &(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::MetafTime>._M_engaged =
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._64_4_;
      (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
      super__Optional_base<unsigned_int,_true,_true>._M_payload =
           (_Optional_payload<unsigned_int,_true,_true,_true>)
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._48_8_;
      *(undefined8 *)
       ((long)&(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
               super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
           nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._56_8_;
    }
    if ((this->minTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == true) {
      if ((this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged != false) {
        return APPENDED;
      }
      return NOT_APPENDED;
    }
    return NOT_APPENDED;
  }
  this_01 = &this->maxTemp;
  (this->maxTemp).freezing =
       (bool)nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._24_1_;
  (this->maxTemp).precise =
       (bool)nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._25_1_;
  _Var5._4_4_ = nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload
                .super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._20_4_;
  _Var5._M_payload =
       nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._M_value.maxTemp.
       tempValue.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload;
  (this->maxTemp).tempValue.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var5;
  (this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)
       nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._48_8_;
  *(undefined8 *)
   ((long)&(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) =
       nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._56_8_;
  *(undefined4 *)
   &(this->maxTime).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged =
       nextGroup.super__Optional_base<metaf::MinMaxTemperatureGroup,_true,_true>._M_payload.
       super__Optional_payload_base<metaf::MinMaxTemperatureGroup>._M_payload._64_4_;
  if (((this->minTemp).freezing != false) || ((this->maxTemp).freezing == false)) {
    oVar7 = Temperature::temperature(this_00);
    oVar8 = Temperature::temperature(this_01);
    if (oVar7.super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>
        ._M_payload._M_value <=
        oVar8.super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>
        ._M_payload._M_value) goto LAB_0018bf11;
  }
  uVar3._0_1_ = (this->minTemp).freezing;
  uVar3._1_1_ = (this->minTemp).precise;
  uVar3._2_2_ = *(undefined2 *)&(this->minTemp).field_0xa;
  _Var4 = (this_00->tempValue).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>;
  bVar1 = (this->maxTemp).precise;
  (this->minTemp).freezing = (this->maxTemp).freezing;
  (this->minTemp).precise = bVar1;
  (this_00->tempValue).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (this_01->tempValue).super__Optional_base<int,_true,_true>._M_payload.
       super__Optional_payload_base<int>;
  __tmp._8_2_ = SUB42(uVar3,0);
  (this->maxTemp).freezing = __tmp.freezing;
  (this->maxTemp).precise = __tmp.precise;
  (this_01->tempValue).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> = _Var4;
  std::optional<metaf::MetafTime>::swap(&this->minTime,&this->maxTime);
LAB_0018bf11:
  this->isIncomplete = false;
  return APPENDED;
}

Assistant:

AppendResult MinMaxTemperatureGroup::appendForecast(const std::string & group) {
	static const auto error = AppendResult::NOT_APPENDED;
	if (minTemp.isReported() && maxTemp.isReported() && !isIncomplete) return error;
	const auto nextGroup = fromForecast(group);
	if (!nextGroup.has_value()) return error;
	if (isIncomplete != nextGroup->isIncomplete) return error;
	if (!isIncomplete) {
		// Minimum or maximum temperature point specified explicitly
		// Get minimum either from *this or from nextGroup, and maximum from other group
		// Make sure appending two minimums or two maximums will result in error
		if (minTemp.isReported() && nextGroup->minTemp.isReported()) return error;
		if (maxTemp.isReported() && nextGroup->maxTemp.isReported()) return error;
		if (!minTemp.isReported() && nextGroup->minTemp.isReported()) {
			minTemp = nextGroup->minTemp;
			minTime = nextGroup->minTime;
		}
		if (!maxTemp.isReported() && nextGroup->maxTemp.isReported()) {
			maxTemp = nextGroup->maxTemp;
			maxTime = nextGroup->maxTime;
		}
		if (!minTemp.isReported() || !maxTemp.isReported()) return error;
	} else {
		maxTemp = nextGroup->maxTemp;
		maxTime = nextGroup->maxTime;
		if ((!minTemp.isFreezing() && maxTemp.isFreezing()) || 
			*minTemp.temperature() > *maxTemp.temperature())
		{
			std::swap(minTemp, maxTemp);
			std::swap(minTime, maxTime);
		}
		isIncomplete = false;
	}
	return AppendResult::APPENDED;
}